

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_NtkPrintVecWin(Acb_Ntk_t *p,Vec_Int_t *vVec,char *pName)

{
  int iObj;
  long lVar1;
  
  printf("%s: \n",pName);
  for (lVar1 = 0; lVar1 < vVec->nSize; lVar1 = lVar1 + 1) {
    iObj = Abc_Lit2Var(vVec->pArray[lVar1]);
    Acb_NtkPrintNode(p,iObj);
  }
  putchar(10);
  return;
}

Assistant:

void Acb_NtkPrintVecWin( Acb_Ntk_t * p, Vec_Int_t * vVec, char * pName )
{
    int i;
    printf( "%s: \n", pName );
    for ( i = 0; i < vVec->nSize; i++ )
        Acb_NtkPrintNode( p, Abc_Lit2Var(vVec->pArray[i]) );
    printf( "\n" );
}